

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

appender fmt::v10::detail::write_float<fmt::v10::appender,fmt::v10::detail::big_decimal_fp,char>
                   (appender out,big_decimal_fp *f,format_specs<char> *specs,float_specs fspecs,
                   locale_ref loc)

{
  appender aVar1;
  format_specs<char> *specs_local;
  big_decimal_fp *f_local;
  locale_ref loc_local;
  float_specs fspecs_local;
  appender out_local;
  
  aVar1 = do_write_float<fmt::v10::appender,fmt::v10::detail::big_decimal_fp,char,fmt::v10::detail::digit_grouping<char>>
                    (out,f,specs,fspecs,loc);
  return (appender)
         aVar1.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container.container;
}

Assistant:

FMT_CONSTEXPR20 auto write_float(OutputIt out, const DecimalFP& f,
                                 const format_specs<Char>& specs,
                                 float_specs fspecs, locale_ref loc)
    -> OutputIt {
  if (is_constant_evaluated()) {
    return do_write_float<OutputIt, DecimalFP, Char,
                          fallback_digit_grouping<Char>>(out, f, specs, fspecs,
                                                         loc);
  } else {
    return do_write_float(out, f, specs, fspecs, loc);
  }
}